

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void check_decl_align(c2m_ctx_t c2m_ctx,decl_spec *decl_spec)

{
  uint uVar1;
  uint uVar2;
  pos_t pVar3;
  
  uVar1 = decl_spec->align;
  if (-1 < (int)uVar1) {
    uVar2 = type_align(decl_spec->type);
    if (uVar1 < uVar2) {
      pVar3 = get_node_pos(c2m_ctx,decl_spec->align_node);
      error(c2m_ctx,0x18d50c,pVar3.fname,pVar3._8_8_);
      return;
    }
  }
  return;
}

Assistant:

static void check_decl_align (c2m_ctx_t c2m_ctx, struct decl_spec *decl_spec) {
  if (decl_spec->align < 0) return;
  if (decl_spec->align < type_align (decl_spec->type))
    error (c2m_ctx, POS (decl_spec->align_node),
           "requested alignment is less than minimum alignment for the type");
}